

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<void_(void_*,_unsigned_long)>::FunctionMockerBase
          (FunctionMockerBase<void_(void_*,_unsigned_long)> *this)

{
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001ce938;
  (this->current_spec_).function_mocker_ = this;
  ((linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *)
  ((long)&(this->current_spec_).matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
          super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
          super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
          super_MatcherBase<unsigned_long> + 8))->value_ = (MatcherInterface<unsigned_long> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->current_spec_).matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
          super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
          super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
          super_MatcherBase<unsigned_long> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->current_spec_).matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
               super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
               super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
               super_MatcherBase<unsigned_long> + 0x10);
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
  super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
  super_MatcherBase<unsigned_long>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001cc0b0;
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
  super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl.super_MatcherBase<void_*>.
  impl_.value_ = (MatcherInterface<void_*> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->current_spec_).matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
          super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl.
          super_MatcherBase<void_*>.impl_ + 8))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->current_spec_).matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
               super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl.
               super_MatcherBase<void_*>.impl_ + 8);
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
  super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl.super_MatcherBase<void_*>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001ce988;
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}